

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O2

void overwrite_data(string *filename,Elf64_Off offset,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string data;
  ofstream file;
  byte abStack_200 [480];
  
  std::ofstream::ofstream(&file,(string *)filename,_S_out|_S_in|_S_bin);
  if ((abStack_200[*(long *)(_file + -0x18)] & 5) == 0) {
    data._M_dataplus._M_p = (pointer)&data.field_2;
    std::__cxx11::string::_M_construct((ulong)&data,(char)str->_M_string_length);
    std::ostream::seekp(&file,offset,0);
    std::ostream::write((char *)&file,(long)data._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&data);
    std::ofstream::~ofstream(&file);
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(__return_storage_ptr__,"Error opening file",filename);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void overwrite_data( const std::string& filename,
                     Elf64_Off          offset,
                     const std::string& str )
{
    std::ofstream file( filename,
                        std::ios::in | std::ios::out | std::ios::binary );
    if ( !file )
        throw "Error opening file" + filename;
    std::string data( str.length(), '-' );
    file.seekp( (std::streampos)offset );
    file.write( data.c_str(), data.length() + 1 );
}